

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O1

void google::protobuf::compiler::ruby::GenerateBinaryDescriptor
               (FileDescriptor *file,Printer *printer,string *error)

{
  char cVar1;
  char *in_RCX;
  FileDescriptor *extraout_RDX;
  FileDescriptor *extraout_RDX_00;
  FileDescriptor *extraout_RDX_01;
  FileDescriptor *file_00;
  FileDescriptor *extraout_RDX_02;
  ulong uVar2;
  bool bVar3;
  string_view text;
  string_view src;
  string c_escaped;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  FileDescriptor *local_b0;
  Printer *local_a8;
  long *local_a0;
  pointer local_98;
  long local_90 [2];
  undefined1 local_80 [48];
  string local_50;
  
  SerializedDescriptor_abi_cxx11_(&local_50,(ruby *)file,(FileDescriptor *)error);
  src._M_str = in_RCX;
  src._M_len = (size_t)local_50._M_dataplus._M_p;
  absl::lts_20250127::CHexEscape_abi_cxx11_(&local_d0,(lts_20250127 *)local_50._M_string_length,src)
  ;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_b0 = file;
  local_a8 = printer;
  std::__cxx11::string::reserve((ulong)&local_f0);
  file_00 = extraout_RDX;
  if (local_d0._M_string_length != 0) {
    uVar2 = 1;
    do {
      if ((local_d0._M_dataplus._M_p[uVar2 - 1] == '#') && (uVar2 < local_d0._M_string_length)) {
        cVar1 = local_d0._M_dataplus._M_p[uVar2];
        if ((cVar1 == '$') || ((cVar1 == '{' || (cVar1 == '@')))) {
          local_80._0_8_ = (pointer)0x1;
          local_80._8_8_ = "\\";
          absl::lts_20250127::StrAppend(&local_f0,(AlphaNum *)local_80);
        }
      }
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)&local_d0);
      local_80._0_8_ = local_98;
      local_80._8_8_ = local_a0;
      absl::lts_20250127::StrAppend(&local_f0,(AlphaNum *)local_80);
      file_00 = extraout_RDX_00;
      if (local_a0 != local_90) {
        operator_delete(local_a0,local_90[0] + 1);
        file_00 = extraout_RDX_01;
      }
      bVar3 = uVar2 < local_d0._M_string_length;
      uVar2 = uVar2 + 1;
    } while (bVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    file_00 = extraout_RDX_02;
  }
  DumpImportList_abi_cxx11_((string *)local_80,(ruby *)local_b0,file_00);
  text._M_str = 
  "\ndescriptor_data = \"$descriptor_data$\"\n\npool = ::Google::Protobuf::DescriptorPool.generated_pool\npool.add_serialized_file(descriptor_data)\n\n"
  ;
  text._M_len = 0x8c;
  io::Printer::Print<char[16],std::__cxx11::string,char[8],std::__cxx11::string>
            (local_a8,text,(char (*) [16])"descriptor_data",&local_f0,(char (*) [8])0x50a053,
             (string *)local_80);
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenerateBinaryDescriptor(const FileDescriptor* file, io::Printer* printer,
                              std::string* error) {
  printer->Print(R"(
descriptor_data = "$descriptor_data$"

pool = ::Google::Protobuf::DescriptorPool.generated_pool
pool.add_serialized_file(descriptor_data)

)",
                 "descriptor_data", RubyEscape(SerializedDescriptor(file)),
                 "imports", DumpImportList(file));
}